

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMessenger.cxx
# Opt level: O1

void __thiscall
cmMessenger::IssueMessage
          (cmMessenger *this,MessageType t,string *text,cmListFileBacktrace *backtrace)

{
  bool bVar1;
  MessageType t_00;
  cmMessenger *this_00;
  
  this_00 = this;
  t_00 = ConvertMessageType(this,t);
  if (t_00 == t) {
    bVar1 = IsMessageTypeVisible(this,t_00);
    this_00 = this;
    if (!bVar1) {
      return;
    }
  }
  DisplayMessage(this_00,t_00,text,backtrace);
  return;
}

Assistant:

void cmMessenger::IssueMessage(cmake::MessageType t, const std::string& text,
                               const cmListFileBacktrace& backtrace) const
{
  bool force = false;
  if (!force) {
    // override the message type, if needed, for warnings and errors
    cmake::MessageType override = this->ConvertMessageType(t);
    if (override != t) {
      t = override;
      force = true;
    }
  }

  if (!force && !this->IsMessageTypeVisible(t)) {
    return;
  }
  this->DisplayMessage(t, text, backtrace);
}